

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  mapped_type *__a;
  undefined8 *in_RSI;
  int in_EDI;
  thread keyReader;
  Parameters parameters;
  Callback cbAudio;
  AudioLogger audioLogger;
  ofstream fout;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> nTimes;
  deque<int,_std::allocator<int>_> keyPressedQueue;
  size_t totalSize_bytes;
  time_point tEnd;
  time_point tStart;
  int nChannels;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  size_t *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  int in_stack_fffffffffffffb54;
  mapped_type *in_stack_fffffffffffffb58;
  function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
  *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb68;
  int iVar3;
  int iVar4;
  allocator<char> *in_stack_fffffffffffffb70;
  key_type *in_stack_fffffffffffffb78;
  key_type *__k;
  undefined4 in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  deque<int,_std::allocator<int>_> *in_stack_fffffffffffffb90;
  int local_464;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  duration<long,std::ratio<1l,1000l>> local_448 [4];
  int in_stack_fffffffffffffbbc;
  Parameters *in_stack_fffffffffffffbf0;
  AudioLogger *in_stack_fffffffffffffbf8;
  char local_390 [640];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  byte local_f3;
  byte local_f2;
  undefined1 local_f1 [40];
  undefined1 local_c9 [33];
  int local_a8;
  byte local_a3;
  byte local_a2;
  undefined1 local_a1 [56];
  allocator<char> local_69;
  string local_68 [36];
  int local_44;
  undefined8 *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  printf("Usage: %s output.kbd [-cN]\n",*in_RSI);
  printf("    -cN - select capture device N\n");
  printf("    -CN - number N of capture channels N\n");
  printf("\n");
  if (local_8 < 2) {
    local_4 = -0x7f;
  }
  else {
    parseCmdArguments_abi_cxx11_
              (in_stack_fffffffffffffbbc,
               (char **)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    std::allocator<char>::allocator();
    local_a2 = 0;
    local_a3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 in_stack_fffffffffffffb78);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffb90 = (deque<int,_std::allocator<int>_> *)local_a1;
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                 (char *)in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_a3 = 1;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                   in_stack_fffffffffffffb78);
      in_stack_fffffffffffffb84 =
           std::__cxx11::stoi(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,0);
      local_464 = in_stack_fffffffffffffb84;
    }
    else {
      local_464 = 0;
    }
    if ((local_a3 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_a1 + 1));
    }
    if ((local_a2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_a1);
    }
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    __k = (key_type *)local_c9;
    local_44 = local_464;
    std::allocator<char>::allocator();
    local_f2 = 0;
    local_f3 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb84,local_464),(char *)__k,in_stack_fffffffffffffb70);
    __a = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffb84,local_464),__k);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      in_stack_fffffffffffffb60 =
           (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
            *)local_f1;
      std::allocator<char>::allocator();
      local_f2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb84,local_464),(char *)__k,(allocator<char> *)__a);
      local_f3 = 1;
      in_stack_fffffffffffffb58 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb84,local_464),__k);
      in_stack_fffffffffffffb54 =
           std::__cxx11::stoi(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,0);
      iVar3 = in_stack_fffffffffffffb54;
    }
    else {
      iVar3 = 0;
    }
    iVar4 = iVar3;
    if ((local_f3 & 1) != 0) {
      std::__cxx11::string::~string((string *)(local_f1 + 1));
    }
    if ((local_f2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_f1);
    }
    std::__cxx11::string::~string((string *)(local_c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    local_a8 = iVar3;
    local_100 = std::chrono::_V2::system_clock::now();
    local_108 = std::chrono::_V2::system_clock::now();
    local_110 = 0;
    std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x13a125);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x13a134);
    printf("Recording %d frames per key press\n",0xb);
    std::ofstream::ofstream(local_390,(char *)local_10[1],_S_bin);
    std::ostream::write(local_390,0x15d020);
    AudioLogger::AudioLogger((AudioLogger *)CONCAT44(in_stack_fffffffffffffb54,iVar3));
    std::
    function<void(std::vector<std::array<float,512ul>,std::allocator<std::array<float,512ul>>>const&)>
    ::function<main::__0,void>
              ((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                *)CONCAT44(in_stack_fffffffffffffb54,iVar3),
               (anon_class_40_5_5569f316 *)
               CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48));
    AudioLogger::Parameters::Parameters((Parameters *)&stack0xfffffffffffffbe0);
    std::
    function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
    ::operator=(in_stack_fffffffffffffb60,
                (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                 *)in_stack_fffffffffffffb58);
    bVar1 = AudioLogger::install(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    if (bVar1) {
      printf("\n");
      printf("To stop capturing press Ctrl+C\n");
      printf(
            "On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually\n"
            );
      printf("\n");
      std::thread::thread<main::__1,,void>
                ((thread *)__a,(type *)CONCAT44(iVar4,in_stack_fffffffffffffb68));
      do {
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  (local_448,(int *)&stack0xfffffffffffffbb4);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)__a);
      } while( true );
    }
    fprintf(_stderr,"Failed to install audio logger\n");
    local_4 = -1;
    AudioLogger::Parameters::~Parameters((Parameters *)0x13a2ab);
    std::
    function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
    ::~function((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                 *)0x13a2b8);
    AudioLogger::~AudioLogger((AudioLogger *)0x13a2c5);
    std::ofstream::~ofstream(local_390);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               0x13a2df);
    std::deque<int,_std::allocator<int>_>::~deque(in_stack_fffffffffffffb90);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x13a2f9);
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    auto tStart = std::chrono::high_resolution_clock::now();
    auto tEnd = std::chrono::high_resolution_clock::now();

    size_t totalSize_bytes = 0;
    std::deque<int> keyPressedQueue;
    std::map<int, int> nTimes;
    printf("Recording %d frames per key press\n", kBufferSizeTrain_frames);

    std::ofstream fout(argv[1], std::ios::binary);
    fout.write((char *)(&kBufferSizeTrain_frames), sizeof(kBufferSizeTrain_frames));

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        tEnd = std::chrono::high_resolution_clock::now();

        int keyPressed = keyPressedQueue.front();
        keyPressedQueue.pop_front();

        fout.write((char *)(&keyPressed), sizeof(keyPressed));
        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }
        ++nTimes[keyPressed];

        printf("Last recorded key - %3d '%s'. Total times recorded so far - %3d. Total data saved: %g MB\n",
               keyPressed, kKeyText.at(keyPressed), nTimes[keyPressed], ((float)(totalSize_bytes)/1024.0f/1024.0f));

        keyPressed = -1;
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    printf("\n");
    printf("To stop capturing press Ctrl+C\n");
    printf("On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually\n");
    printf("\n");

    std::thread keyReader = std::thread([&]() {
        struct termios oldt, newt;
        tcgetattr ( STDIN_FILENO, &oldt );
        newt = oldt;
        newt.c_lflag &= ~( ICANON | ECHO );
        tcsetattr ( STDIN_FILENO, TCSANOW, &newt );
        while (true) {
            int key = getchar();
            tStart = std::chrono::high_resolution_clock::now();
            keyPressedQueue.push_back(key);
            if (audioLogger.record(kBufferSizeTrain_s, 2) == false) {
                fprintf(stderr, "error : failed to record\n");
            }
        }
        tcsetattr ( STDIN_FILENO, TCSANOW, &oldt );
    });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }

    keyReader.join();

    fout.close();

    return 0;
}